

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_35::InMemoryFile::zero(InMemoryFile *this,uint64_t offset,uint64_t zeroSize)

{
  MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *this_00;
  Impl *this_01;
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong capacity;
  Fault f;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  Fault local_48;
  MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *local_40;
  Impl *local_38;
  
  if (zeroSize != 0) {
    this_00 = &this->impl;
    _::Mutex::lock(&this_00->mutex,EXCLUSIVE);
    this_01 = &(this->impl).value;
    local_40 = this_00;
    local_38 = this_01;
    iVar2 = (**((this->impl).value.clock)->_vptr_Clock)();
    (this->impl).value.lastModified.value.value = CONCAT44(extraout_var,iVar2);
    capacity = zeroSize + offset;
    if (CARRY8(zeroSize,offset)) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                (&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x351,FAILED,"end >= offset","\"zero() request overflows uint64\"",
                 (char (*) [32])"zero() request overflows uint64");
      _::Debug::Fault::fatal(&local_48);
    }
    Impl::ensureCapacity(this_01,capacity);
    uVar1 = (this->impl).value.size;
    if (capacity < uVar1) {
      capacity = uVar1;
    }
    (this->impl).value.size = capacity;
    memset((this->impl).value.bytes.ptr + offset,0,zeroSize);
    _::Mutex::unlock(&this_00->mutex,EXCLUSIVE);
  }
  return;
}

Assistant:

void zero(uint64_t offset, uint64_t zeroSize) const override {
    if (zeroSize == 0) return;
    auto lock = impl.lockExclusive();
    lock->modified();
    uint64_t end = offset + zeroSize;
    KJ_REQUIRE(end >= offset, "zero() request overflows uint64");
    lock->ensureCapacity(end);
    lock->size = kj::max(lock->size, end);
    memset(lock->bytes.begin() + offset, 0, zeroSize);
  }